

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

int SHA1Result(SHA1Context *context,uint8_t *Message_Digest)

{
  int local_24;
  int i;
  uint8_t *Message_Digest_local;
  SHA1Context *context_local;
  
  if ((context == (SHA1Context *)0x0) || (Message_Digest == (uint8_t *)0x0)) {
    context_local._4_4_ = 1;
  }
  else if (context->Corrupted == 0) {
    if (context->Computed == 0) {
      SHA1Finalize(context,0x80);
    }
    for (local_24 = 0; local_24 < 0x14; local_24 = local_24 + 1) {
      Message_Digest[local_24] =
           (uint8_t)(context->Intermediate_Hash[local_24 >> 2] >>
                    (('\x03' - ((byte)local_24 & 3)) * '\b' & 0x1f));
    }
    context_local._4_4_ = 0;
  }
  else {
    context_local._4_4_ = context->Corrupted;
  }
  return context_local._4_4_;
}

Assistant:

int SHA1Result(SHA1Context *context,
    uint8_t Message_Digest[SHA1HashSize])
{
    int i;

    if (!context || !Message_Digest)
        return shaNull;

    if (context->Corrupted)
        return context->Corrupted;

    if (!context->Computed)
        SHA1Finalize(context, 0x80);

    for (i = 0; i < SHA1HashSize; ++i)
        Message_Digest[i] = (uint8_t)(context->Intermediate_Hash[i >> 2]
        >> 8 * (3 - (i & 0x03)));

    return shaSuccess;
}